

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O3

void JsrtRuntime::Uninitialize(void)

{
  JsrtRuntime *this;
  Type pTVar1;
  JsrtContext *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ThreadContext *threadContext;
  
  threadContext = ThreadContext::globalListFirst;
  if (ThreadContext::globalListFirst != (ThreadContext *)0x0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (threadContext->isScriptActive == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
                           ,0x3f,"(!currentThreadContext->IsScriptActive())",
                           "!currentThreadContext->IsScriptActive()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      this = (JsrtRuntime *)threadContext->jsrtRuntime;
      pTVar1 = (threadContext->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>)
               .next;
      while (pJVar2 = this->contextList, pJVar2 != (JsrtContext *)0x0) {
        (*(pJVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[1])(pJVar2,0);
      }
      RentalThreadContextManager::DestroyThreadContext(threadContext);
      ~JsrtRuntime(this);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this,0x70);
      threadContext = pTVar1;
    } while (pTVar1 != (Type)0x0);
  }
  return;
}

Assistant:

void JsrtRuntime::Uninitialize()
{
    ThreadContext* currentThreadContext = ThreadContext::GetThreadContextList();
    ThreadContext* tmpThreadContext;
    while (currentThreadContext)
    {
        Assert(!currentThreadContext->IsScriptActive());
        JsrtRuntime* currentRuntime = static_cast<JsrtRuntime*>(currentThreadContext->GetJSRTRuntime());
        tmpThreadContext = currentThreadContext;
        currentThreadContext = currentThreadContext->Next();

#ifdef CHAKRA_STATIC_LIBRARY
        // xplat-todo: Cleanup staticlib shutdown. This only shuts down threads.
        // Other closing contexts / finalizers having trouble with current
        // runtime/context.
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
#else
        currentRuntime->CloseContexts();
        RentalThreadContextManager::DestroyThreadContext(tmpThreadContext);
        HeapDelete(currentRuntime);
#endif
    }
}